

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O3

void * crn_compress(crn_comp_params *comp_params,crn_uint32 *compressed_size,
                   crn_uint32 *pActual_quality_level,float *pActual_bitrate)

{
  bool bVar1;
  vector<unsigned_char> local_18;
  
  *compressed_size = 0;
  if (pActual_quality_level != (crn_uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if (comp_params->m_file_type < 2) {
    if (0xff < comp_params->m_quality_level) {
      return (void *)0x0;
    }
    if (0xff < comp_params->m_dxt1a_alpha_threshold) {
      return (void *)0x0;
    }
    if ((((comp_params->m_faces == 6) || (comp_params->m_faces == 1)) &&
        (0xffffefff < comp_params->m_width - 0x1001)) &&
       (0xffffefff < comp_params->m_height - 0x1001)) {
      if (comp_params->m_levels - 0x11 < 0xfffffff0) {
        return (void *)0x0;
      }
      if (0xe < (ulong)comp_params->m_format) {
        return (void *)0x0;
      }
      if (((comp_params->m_crn_color_endpoint_palette_size == 0 ||
            0xffffe006 < comp_params->m_crn_color_endpoint_palette_size - 0x2001) &&
          (comp_params->m_crn_color_selector_palette_size == 0 ||
           0xffffe006 < comp_params->m_crn_color_selector_palette_size - 0x2001)) &&
         (comp_params->m_crn_alpha_endpoint_palette_size == 0 ||
          0xffffe006 < comp_params->m_crn_alpha_endpoint_palette_size - 0x2001)) {
        if (comp_params->m_crn_alpha_selector_palette_size == 0) {
          if (3 < comp_params->m_alpha_component) {
            return (void *)0x0;
          }
        }
        else {
          if (comp_params->m_crn_alpha_selector_palette_size - 0x2001 < 0xffffe007) {
            return (void *)0x0;
          }
          if (3 < comp_params->m_alpha_component) {
            return (void *)0x0;
          }
        }
        if (0xf < comp_params->m_num_helper_threads) {
          return (void *)0x0;
        }
        if (cCRNDXTQualityUber < comp_params->m_dxt_quality) {
          return (void *)0x0;
        }
        if (cCRNDXTCompressorRYG < comp_params->m_dxt_compressor_type) {
          return (void *)0x0;
        }
        local_18.m_p = (uchar *)0x0;
        local_18.m_size = 0;
        local_18.m_capacity = 0;
        bVar1 = crnlib::create_compressed_texture
                          (comp_params,&local_18,pActual_quality_level,pActual_bitrate);
        if (bVar1) {
          *compressed_size = local_18.m_size;
          return local_18.m_p;
        }
        if (local_18.m_p != (uchar *)0x0) {
          crnlib::crnlib_free(local_18.m_p);
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* crn_compress(const crn_comp_params& comp_params, crn_uint32& compressed_size, crn_uint32* pActual_quality_level, float* pActual_bitrate)
{
    compressed_size = 0;
    if (pActual_quality_level)
    {
        *pActual_quality_level = 0;
    }
    if (pActual_bitrate)
    {
        *pActual_bitrate = 0.0f;
    }

    if (!comp_params.check())
    {
        return nullptr;
    }

    crnlib::vector<uint8> crn_file_data;
    if (!create_compressed_texture(comp_params, crn_file_data, pActual_quality_level, pActual_bitrate))
    {
        return nullptr;
    }

    compressed_size = crn_file_data.size();
    return crn_file_data.assume_ownership();
}